

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::UnlockCoin(CWallet *this,COutPoint *output,WalletBatch *batch)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<COutPoint>,_std::_Rb_tree_iterator<COutPoint>_> pVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar4 = std::
          _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
          ::equal_range(&(this->setLockedCoins)._M_t,output);
  sVar2 = (this->setLockedCoins)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
  ::_M_erase_aux(&(this->setLockedCoins)._M_t,(_Base_ptr)pVar4.first._M_node,
                 (_Base_ptr)pVar4.second._M_node);
  if ((batch == (WalletBatch *)0x0) ||
     (sVar2 == (this->setLockedCoins)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return true;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    bVar3 = WalletBatch::EraseLockedUTXO(batch,output);
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::UnlockCoin(const COutPoint& output, WalletBatch* batch)
{
    AssertLockHeld(cs_wallet);
    bool was_locked = setLockedCoins.erase(output);
    if (batch && was_locked) {
        return batch->EraseLockedUTXO(output);
    }
    return true;
}